

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa_util.cpp
# Opt level: O3

bool spvtools::opt::descsroautil::IsDescriptorStruct(IRContext *context,Instruction *var)

{
  DefUseManager *this;
  bool bVar1;
  uint32_t id;
  Instruction *this_00;
  Operand *this_01;
  
  this_00 = anon_unknown_0::GetVariableType(context,var);
  if (this_00 != (Instruction *)0x0) {
    while (this_00->opcode_ == OpTypeArray) {
      if ((context->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(context);
      }
      this = (context->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
      this_01 = Instruction::GetInOperand(this_00,0);
      id = Operand::AsId(this_01);
      this_00 = analysis::DefUseManager::GetDef(this,id);
    }
    if ((this_00->opcode_ == OpTypeStruct) &&
       (bVar1 = IsTypeOfStructuredBuffer(context,this_00), !bVar1)) {
      bVar1 = anon_unknown_0::HasDescriptorDecorations(context,var);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool IsDescriptorStruct(IRContext* context, Instruction* var) {
  Instruction* var_type_inst = GetVariableType(context, var);
  if (var_type_inst == nullptr) return false;

  while (var_type_inst->opcode() == spv::Op::OpTypeArray) {
    var_type_inst = context->get_def_use_mgr()->GetDef(
        var_type_inst->GetInOperand(0).AsId());
  }

  if (var_type_inst->opcode() != spv::Op::OpTypeStruct) return false;

  // All structures with descriptor assignments must be replaced by variables,
  // one for each of their members - with the exceptions of buffers.
  if (IsTypeOfStructuredBuffer(context, var_type_inst)) {
    return false;
  }

  return HasDescriptorDecorations(context, var);
}